

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

_Bool CrawlSpaces(Lexer *lexer)

{
  int *piVar1;
  int iVar2;
  char character;
  _Bool _Var3;
  
  iVar2 = (lexer->tracker).currentTokenPosition;
  if (iVar2 < lexer->length) {
    if (lexer->rawSourceCode[iVar2] == ' ') {
      character = PeekNextCharacter(lexer);
      while( true ) {
        _Var3 = IsCharacter(character," \n\r");
        if (!_Var3) break;
        if (character == '\n') {
          piVar1 = &(lexer->tracker).row;
          *piVar1 = *piVar1 + 1;
          (lexer->tracker).col = 1;
        }
        character = PeekNextCharacter(lexer);
        GetNextCharacter(lexer);
      }
      GetNextCharacter(lexer);
      _Var3 = true;
    }
    else {
      _Var3 = false;
    }
    return _Var3;
  }
  return false;
}

Assistant:

bool CrawlSpaces(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	if (currentChar == ' '){
		char nextChar = PeekNextCharacter(lexer);
		char* checkCharacters = " \n\r";
		while (IsCharacter(nextChar, checkCharacters)){
			if (nextChar == '\n'){
				lexer->tracker.row++;
				lexer->tracker.col = 1;
			}

			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
		}
		GetNextCharacter(lexer);
		return true;
	}
	return false;
}